

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-escape.c
# Opt level: O0

_Bool borg_recall(void)

{
  _Bool _Var1;
  wchar_t diff_cur_from_desired_depth;
  wchar_t diff_max_from_desired_depth;
  
  if ((borg.goal.recalling == L'\0') &&
     ((((_Var1 = borg_zap_rod(sv_rod_recall), _Var1 ||
        (_Var1 = borg_activate_item(act_recall), _Var1)) ||
       (_Var1 = borg_spell_fail(WORD_OF_RECALL,0x3c), _Var1)) ||
      (_Var1 = borg_read_scroll(sv_scroll_word_of_recall), _Var1)))) {
    if ((borg.trait[0x69] < borg.trait[0x6a]) && (borg.trait[0x69] != 0)) {
      if ((borg.trait[0x6a] - borg_depth_hunted_unique < 6) ||
         ((5 < borg.trait[0x69] - borg_depth_hunted_unique ||
          (borg.trait[0x69] - borg_depth_hunted_unique < -4)))) {
        borg_note("# Not resetting recall depth.");
        borg_keypress(0x6e);
      }
      else if (((borg.trait[0x69] < 0x50) || (99 < borg.trait[0x69])) ||
              (borg_race_death[borg_sauron_id] == 0)) {
        if ((borg.goal.fleeing_munchkin & 1U) == 1) {
          borg_note("# Resetting recall depth during munchkin mode.");
          borg_keypress(0x79);
        }
        else if ((borg.trait[0x69] < 100) || (borg.trait[0x6b] != 0)) {
          if ((borg.trait[0x6a] == 99) && (borg_numb_live_unique < L'\x05')) {
            borg_note("# Not Resetting recall depth.");
            borg_keypress(0x6e);
          }
          else {
            borg_note("# Resetting recall depth.");
            borg_keypress(0x79);
          }
        }
        else {
          borg_note("# Not Resetting recall depth.");
          borg_keypress(0x6e);
        }
      }
      else {
        borg_note("# Resetting recall depth.");
        borg_keypress(0x79);
      }
    }
    borg_keypress(0xe000);
    diff_cur_from_desired_depth._3_1_ = true;
  }
  else {
    diff_cur_from_desired_depth._3_1_ = false;
  }
  return diff_cur_from_desired_depth._3_1_;
}

Assistant:

bool borg_recall(void)
{
    /* Multiple "recall" fails */
    if (!borg.goal.recalling) {
        /* Try to "recall" */
        if (borg_zap_rod(sv_rod_recall) || borg_activate_item(act_recall)
            || borg_spell_fail(WORD_OF_RECALL, 60)
            || borg_read_scroll(sv_scroll_word_of_recall)) {

            /* do we need to answer "Set recall depth to current depth? [y/n]" */
            if (borg.trait[BI_CDEPTH] < borg.trait[BI_MAXDEPTH]
                && borg.trait[BI_CDEPTH] != 0) {

                int diff_max_from_desired_depth
                    = borg.trait[BI_MAXDEPTH] - borg_depth_hunted_unique;
                int diff_cur_from_desired_depth
                    = borg.trait[BI_CDEPTH] - borg_depth_hunted_unique;

                /* Reset max depth when current depth is way deeper (5) than the */
                /* third deepest unique. */
                if (diff_max_from_desired_depth > 5
                    && diff_cur_from_desired_depth <= 5
                    && diff_cur_from_desired_depth > -5) {
                    /* Special check on deep levels */
                    if (borg.trait[BI_CDEPTH] >= 80 && borg.trait[BI_CDEPTH] < 100
                        && /* Deep */
                        borg_race_death[borg_sauron_id] != 0) /* Sauron is Dead */
                    {
                        /* Do reset Depth */
                        borg_note("# Resetting recall depth.");
                        borg_keypress('y');
                    }
                    else if (borg.goal.fleeing_munchkin == true) {
                        /* Do reset Depth */
                        borg_note("# Resetting recall depth during munchkin mode.");
                        borg_keypress('y');
                    }
                    else if (borg.trait[BI_CDEPTH] >= 100
                        && !borg.trait[BI_KING]) {
                        /* Do not reset Depth */
                        borg_note("# Not Resetting recall depth.");
                        borg_keypress('n');
                    }
                    else if (borg.trait[BI_MAXDEPTH] == 99
                        && borg_numb_live_unique < 5) {
                        /* Do reset Depth, cleaning up last uniques to hit */
                        /* Morgoth.  Want to keep using up the stock of potions */
                        borg_note("# Not Resetting recall depth.");
                        borg_keypress('n');
                    }
                    else {
                        /* Do reset Depth */
                        borg_note("# Resetting recall depth.");
                        borg_keypress('y');
                    }
                }
                /* reset recall depth in dungeon? */
                else {
                    /* Do not reset Depth */
                    borg_note("# Not resetting recall depth.");
                    borg_keypress('n');
                }
            }

            borg_keypress(ESCAPE);

            /* Success */
            return true;
        }
    }

    /* Nothing */
    return false;
}